

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O1

bool_t xdr_bool(XDR *__xdrs,bool_t *__bp)

{
  int *piVar1;
  uint *puVar2;
  xdr_op xVar3;
  uint uVar4;
  bool_t bVar5;
  undefined8 in_RAX;
  uint local_c;
  
  xVar3 = __xdrs[2].x_op;
  bVar5 = (bool_t)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (xVar3 != XDR_FREE) {
    if (xVar3 == XDR_DECODE) {
      puVar2 = *(uint **)&__xdrs->x_handy + 1;
      if (__xdrs[1].x_private < puVar2) {
        bVar5 = (*(code *)**(undefined8 **)__xdrs)(__xdrs,&local_c);
      }
      else {
        uVar4 = **(uint **)&__xdrs->x_handy;
        local_c = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        *(uint **)&__xdrs->x_handy = puVar2;
        bVar5 = (bool_t)CONCAT71((int7)((ulong)puVar2 >> 8),1);
      }
      if ((char)bVar5 != '\0') {
        *__bp = (uint)(local_c != 0);
      }
    }
    else if (xVar3 == XDR_ENCODE) {
      piVar1 = *(int **)&__xdrs->x_handy + 1;
      if (__xdrs[1].x_base < piVar1) {
        bVar5 = (**(code **)(*(long *)__xdrs + 8))(__xdrs,*__bp != 0);
        return bVar5;
      }
      **(int **)&__xdrs->x_handy = (uint)(*__bp != 0) << 0x18;
      *(int **)&__xdrs->x_handy = piVar1;
    }
    else {
      bVar5 = 0;
    }
  }
  return bVar5;
}

Assistant:

static inline bool
xdr_bool(XDR *xdrs, bool_t *bp)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (xdr_putbool(xdrs, *bp));

	case XDR_DECODE:
		return (xdr_getbool(xdrs, bp));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}